

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O0

int gray_raster_render(PWorker worker,void *buffer,long buffer_size,PVG_FT_Raster_Params *params)

{
  int *__src;
  PVG_FT_Outline *outline;
  PVG_FT_Raster_Params *params_local;
  long buffer_size_local;
  void *buffer_local;
  PWorker worker_local;
  
  __src = (int *)params->source;
  if (__src == (int *)0x0) {
    worker_local._4_4_ = -1;
  }
  else if ((__src[1] == 0) || (*__src < 1)) {
    worker_local._4_4_ = 0;
  }
  else if ((*(long *)(__src + 6) == 0) || (*(long *)(__src + 2) == 0)) {
    worker_local._4_4_ = -1;
  }
  else if (__src[1] == *(int *)(*(long *)(__src + 6) + (long)(*__src + -1) * 4) + 1) {
    if ((params->flags & 1U) == 0) {
      worker_local._4_4_ = -2;
    }
    else if ((params->flags & 2U) == 0) {
      worker_local._4_4_ = -2;
    }
    else {
      if ((params->flags & 4U) == 0) {
        (worker->clip_box).xMin = -0x800000;
        (worker->clip_box).yMin = -0x800000;
        (worker->clip_box).xMax = 0x7fffff;
        (worker->clip_box).yMax = 0x7fffff;
      }
      else {
        (worker->clip_box).xMin = (params->clip_box).xMin;
        (worker->clip_box).yMin = (params->clip_box).yMin;
        (worker->clip_box).xMax = (params->clip_box).xMax;
        (worker->clip_box).yMax = (params->clip_box).yMax;
      }
      gray_init_cells(worker,buffer,buffer_size);
      memcpy(&worker->outline,__src,0x30);
      worker->num_cells = 0;
      worker->invalid = 1;
      worker->band_size = (int)(buffer_size / 0xc0);
      worker->render_span = params->gray_spans;
      worker->render_span_data = params->user;
      worker_local._4_4_ = gray_convert_glyph(worker);
    }
  }
  else {
    worker_local._4_4_ = -1;
  }
  return worker_local._4_4_;
}

Assistant:

static int
  gray_raster_render( RAS_ARG_ void* buffer, long buffer_size,
                      const PVG_FT_Raster_Params*  params )
  {
    const PVG_FT_Outline*  outline    = (const PVG_FT_Outline*)params->source;
    if ( outline == NULL )
      return ErrRaster_Invalid_Outline;

    /* return immediately if the outline is empty */
    if ( outline->n_points == 0 || outline->n_contours <= 0 )
      return 0;

    if ( !outline->contours || !outline->points )
      return ErrRaster_Invalid_Outline;

    if ( outline->n_points !=
           outline->contours[outline->n_contours - 1] + 1 )
      return ErrRaster_Invalid_Outline;

    /* this version does not support monochrome rendering */
    if ( !( params->flags & PVG_FT_RASTER_FLAG_AA ) )
      return ErrRaster_Invalid_Mode;

    if ( !( params->flags & PVG_FT_RASTER_FLAG_DIRECT ) )
      return ErrRaster_Invalid_Mode;

    /* compute clipping box */
    if ( params->flags & PVG_FT_RASTER_FLAG_CLIP )
    {
      ras.clip_box = params->clip_box;
    }
    else
    {
      ras.clip_box.xMin = -(1 << 23);
      ras.clip_box.yMin = -(1 << 23);
      ras.clip_box.xMax =  (1 << 23) - 1;
      ras.clip_box.yMax =  (1 << 23) - 1;
    }

    gray_init_cells( RAS_VAR_ buffer, buffer_size );

    ras.outline   = *outline;
    ras.num_cells = 0;
    ras.invalid   = 1;
    ras.band_size = (int)(buffer_size / (long)(sizeof(TCell) * 8));

    ras.render_span      = (PVG_FT_Raster_Span_Func)params->gray_spans;
    ras.render_span_data = params->user;

    return gray_convert_glyph( RAS_VAR );
  }